

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.hpp
# Opt level: O1

void duckdb::DecimalParquetValueConversion<duckdb::hugeint_t,_false>::PlainSkip<false>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  ulong req_len;
  
  ByteBuffer::available(plain_data,4);
  req_len = (ulong)*(uint *)plain_data->ptr;
  plain_data->len = plain_data->len - 4;
  plain_data->ptr = (data_ptr_t)((long)plain_data->ptr + 4);
  ByteBuffer::available(plain_data,req_len);
  plain_data->len = plain_data->len - req_len;
  plain_data->ptr = plain_data->ptr + req_len;
  return;
}

Assistant:

static void PlainSkip(ByteBuffer &plain_data, ColumnReader &reader) {
		uint32_t decimal_len = FIXED_LENGTH ? reader.Schema().type_length : plain_data.read<uint32_t>();
		plain_data.inc(decimal_len);
	}